

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

optional<pbrt::LightLeSample> * __thiscall
pbrt::PointLight::SampleLe
          (optional<pbrt::LightLeSample> *__return_storage_ptr__,PointLight *this,Point2f u1,
          Point2f u2,SampledWavelengths *lambda,Float time)

{
  undefined8 uVar1;
  uintptr_t uVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  SampledSpectrum SVar19;
  undefined1 auVar15 [56];
  undefined1 auVar18 [56];
  
  auVar13._8_56_ = in_register_00001208;
  auVar13._0_8_ = u1.super_Tuple2<pbrt::Point2,_float>;
  auVar16 = ZEXT816(0) << 0x40;
  auVar18 = ZEXT856(0);
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[0][1] * 0.0)),
                           auVar16,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][0]))
  ;
  auVar8 = vfmadd231ss_fma(auVar8,auVar16,
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][2]));
  fVar9 = auVar8._0_4_ + (this->super_LightBase).renderFromLight.m.m[0][3];
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[1][1] * 0.0)),
                           auVar16,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][0]))
  ;
  auVar8 = vfmadd231ss_fma(auVar8,auVar16,
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][2]));
  fVar4 = auVar8._0_4_ + (this->super_LightBase).renderFromLight.m.m[1][3];
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[2][1] * 0.0)),
                           auVar16,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][0]))
  ;
  auVar8 = vfmadd231ss_fma(auVar8,auVar16,
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][2]));
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[3][1] * 0.0))
                            ,auVar16,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][0]
                                            ));
  auVar12 = vfmadd231ss_fma(auVar12,auVar16,
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][2]));
  fVar5 = auVar12._0_4_ + (this->super_LightBase).renderFromLight.m.m[3][3];
  bVar3 = fVar5 == 1.0;
  fVar6 = auVar8._0_4_ + (this->super_LightBase).renderFromLight.m.m[2][3];
  auVar8 = vinsertps_avx(ZEXT416((uint)bVar3 * (int)fVar9 + (uint)!bVar3 * (int)(fVar9 / fVar5)),
                         ZEXT416((uint)bVar3 * (int)fVar4 + (uint)!bVar3 * (int)(fVar4 / fVar5)),
                         0x10);
  auVar7 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar13._0_16_,
                           SUB6416(ZEXT464(0x3f800000),0));
  auVar12 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar7,auVar7);
  auVar12 = vmaxss_avx(auVar12,auVar16);
  if (auVar12._0_4_ < 0.0) {
    auVar18 = ZEXT856(0);
    fVar9 = sqrtf(auVar12._0_4_);
  }
  else {
    auVar12 = vsqrtss_avx(auVar12,auVar12);
    fVar9 = auVar12._0_4_;
  }
  auVar12 = vmovshdup_avx(auVar13._0_16_);
  fVar4 = auVar12._0_4_ * 6.2831855;
  fVar10 = cosf(fVar4);
  fVar11 = sinf(fVar4);
  uVar2 = (this->super_LightBase).mediumInterface.outside.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  fVar4 = this->scale;
  auVar12._4_4_ = fVar4;
  auVar12._0_4_ = fVar4;
  auVar12._8_4_ = fVar4;
  auVar12._12_4_ = fVar4;
  auVar15 = ZEXT856(auVar12._8_8_);
  SVar19 = DenselySampledSpectrum::Sample(&this->I,lambda);
  auVar17._0_8_ = SVar19.values.values._8_8_;
  auVar17._8_56_ = auVar18;
  auVar14._0_8_ = SVar19.values.values._0_8_;
  auVar14._8_56_ = auVar15;
  auVar16 = vmovlhps_avx(auVar14._0_16_,auVar17._0_16_);
  auVar12 = vinsertps_avx(ZEXT416((uint)(fVar9 * fVar10)),ZEXT416((uint)(fVar9 * fVar11)),0x10);
  __return_storage_ptr__->set = true;
  *(float *)&__return_storage_ptr__->optionalValue = auVar16._0_4_ * fVar4;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 4) = auVar16._4_4_ * fVar4;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 8) = auVar16._8_4_ * fVar4;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0xc) = auVar16._12_4_ * fVar4;
  uVar1 = vmovlps_avx(auVar8);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar1;
  *(uint *)((long)&__return_storage_ptr__->optionalValue + 0x18) =
       (uint)bVar3 * (int)fVar6 + (uint)!bVar3 * (int)(fVar6 / fVar5);
  uVar1 = vmovlps_avx(auVar12);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = uVar1;
  *(int *)((long)&__return_storage_ptr__->optionalValue + 0x24) = auVar7._0_4_;
  *(Float *)((long)&__return_storage_ptr__->optionalValue + 0x28) = time;
  *(uintptr_t *)((long)&__return_storage_ptr__->optionalValue + 0x30) = uVar2;
  (__return_storage_ptr__->optionalValue).__data[0x88] = '\0';
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = 0x3da2f9833f800000;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightLeSample> PointLight::SampleLe(Point2f u1, Point2f u2,
                                                   SampledWavelengths &lambda,
                                                   Float time) const {
    Point3f p = renderFromLight(Point3f(0, 0, 0));
    Ray ray(p, SampleUniformSphere(u1), time, mediumInterface.outside);
    return LightLeSample(scale * I.Sample(lambda), ray, 1, UniformSpherePDF());
}